

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

float64 float64_sqrt(float64 a)

{
  bits32 bVar1;
  bits64 bVar2;
  bits64 local_58;
  bits64 term1;
  bits64 term0;
  bits64 rem1;
  bits64 rem0;
  bits64 doubleZSig;
  bits64 zSig;
  bits64 aSig;
  int16 zExp;
  int16 aExp;
  float64 fStack_18;
  flag aSign;
  float64 a_local;
  
  fStack_18 = a;
  zSig = extractFloat64Frac(a);
  aSig._4_2_ = extractFloat64Exp(fStack_18);
  aSig._7_1_ = extractFloat64Sign(fStack_18);
  if (aSig._4_2_ == 0x7ff) {
    if (zSig == 0) {
      if (aSig._7_1_ == '\0') {
        a_local = fStack_18;
      }
      else {
        float_raise('\x01');
        a_local = 0xffffffffffffffff;
      }
    }
    else {
      a_local = propagateFloat64NaN(fStack_18,fStack_18);
    }
  }
  else if (aSig._7_1_ == '\0') {
    if (aSig._4_2_ == 0) {
      if (zSig == 0) {
        return 0;
      }
      normalizeFloat64Subnormal(zSig,(int16 *)((long)&aSig + 4),&zSig);
    }
    aSig._2_2_ = (short)(aSig._4_2_ + -0x3ff >> 1) + 0x3fe;
    zSig = zSig | 0x10000000000000;
    bVar1 = estimateSqrt32(aSig._4_2_,(bits32)(zSig >> 0x15));
    doubleZSig = (bits64)bVar1;
    zSig = zSig << (9 - ((byte)aSig._4_2_ & 1) & 0x3f);
    bVar2 = estimateDiv128To64(zSig,0,doubleZSig << 0x20);
    doubleZSig = bVar2 + doubleZSig * 0x40000000;
    if ((doubleZSig & 0x1ff) < 6) {
      rem0 = doubleZSig * 2;
      mul64To128(doubleZSig,doubleZSig,&term1,&local_58);
      sub128(zSig,0,term1,local_58,&rem1,&term0);
      while ((long)rem1 < 0) {
        doubleZSig = doubleZSig - 1;
        rem0 = rem0 - 2;
        add128(rem1,term0,doubleZSig >> 0x3f,rem0 | 1,&rem1,&term0);
      }
      doubleZSig = (long)(int)(uint)(rem1 != 0 || term0 != 0) | doubleZSig;
    }
    a_local = roundAndPackFloat64('\0',aSig._2_2_,doubleZSig);
  }
  else if (aSig._4_2_ == 0 && zSig == 0) {
    a_local = fStack_18;
  }
  else {
    float_raise('\x01');
    a_local = 0xffffffffffffffff;
  }
  return a_local;
}

Assistant:

float64 float64_sqrt( float64 a )
{
	flag aSign;
	int16 aExp, zExp;
	bits64 aSig, zSig, doubleZSig;
	bits64 rem0, rem1, term0, term1;
//    float64 z;

	aSig = extractFloat64Frac( a );
	aExp = extractFloat64Exp( a );
	aSign = extractFloat64Sign( a );
	if ( aExp == 0x7FF ) {
		if ( aSig ) return propagateFloat64NaN( a, a );
		if ( ! aSign ) return a;
		float_raise( float_flag_invalid );
		return float64_default_nan;
	}
	if ( aSign ) {
		if ( ( aExp | aSig ) == 0 ) return a;
		float_raise( float_flag_invalid );
		return float64_default_nan;
	}
	if ( aExp == 0 ) {
		if ( aSig == 0 ) return 0;
		normalizeFloat64Subnormal( aSig, &aExp, &aSig );
	}
	zExp = ( ( aExp - 0x3FF )>>1 ) + 0x3FE;
	aSig |= LIT64( 0x0010000000000000 );
	zSig = estimateSqrt32( aExp, aSig>>21 );
	aSig <<= 9 - ( aExp & 1 );
	zSig = estimateDiv128To64( aSig, 0, zSig<<32 ) + ( zSig<<30 );
	if ( ( zSig & 0x1FF ) <= 5 ) {
		doubleZSig = zSig<<1;
		mul64To128( zSig, zSig, &term0, &term1 );
		sub128( aSig, 0, term0, term1, &rem0, &rem1 );
		while ( (sbits64) rem0 < 0 ) {
			--zSig;
			doubleZSig -= 2;
			add128( rem0, rem1, zSig>>63, doubleZSig | 1, &rem0, &rem1 );
		}
		zSig |= ( ( rem0 | rem1 ) != 0 );
	}
	return roundAndPackFloat64( 0, zExp, zSig );

}